

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

int __thiscall gvr::PLYWriter::open(PLYWriter *this,char *__file,int __oflag,...)

{
  value_type pPVar1;
  bool bVar2;
  _Ios_Iostate _Var3;
  int iVar4;
  size_type sVar5;
  reference ppPVar6;
  ulong uVar7;
  size_t i;
  PLYElement *in_stack_ffffffffffffffc0;
  ulong local_20;
  ply_encoding local_14;
  
  local_14 = __oflag;
  if (__oflag == 1) {
    bVar2 = gutil::isMSBFirst();
    if (bVar2) {
      local_14 = ply_big_endian;
    }
    else {
      local_14 = ply_little_endian;
    }
  }
  this->enc = local_14;
  for (local_20 = 0;
      sVar5 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size(&this->list),
      local_20 < sVar5; local_20 = local_20 + 1) {
    ppPVar6 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                        (&this->list,local_20);
    pPVar1 = *ppPVar6;
    if (pPVar1 != (value_type)0x0) {
      PLYElement::~PLYElement(in_stack_ffffffffffffffc0);
      operator_delete(pPVar1);
    }
  }
  std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::clear
            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)0x1464d0);
  this->element = (PLYElement *)0x0;
  this->header_complete = false;
  uVar7 = std::ofstream::is_open();
  if ((uVar7 & 1) != 0) {
    std::ofstream::close();
  }
  _Var3 = (int)this + 0x48 + (int)*(undefined8 *)(*(long *)&this->out + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions(_Var3);
  iVar4 = std::ofstream::open((char *)&this->out,(_Ios_Openmode)__file);
  return iVar4;
}

Assistant:

void PLYWriter::open(const char *name, ply_encoding encoding)
{
  // set encoding

  if (encoding == ply_binary)
  {
    if (gutil::isMSBFirst())
    {
      encoding=ply_big_endian;
    }
    else
    {
      encoding=ply_little_endian;
    }
  }

  enc=encoding;

  // empty list, close file (if necessary) and open new file

  for (size_t i=0; i<list.size(); i++)
  {
    delete list[i];
  }

  list.clear();
  element=0;

  header_complete=false;

  if (out.is_open())
  {
    out.close();
  }

  out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  out.open(name, std::ios_base::binary);
}